

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void fs_print_error(string_view path1,string_view path2,string_view fname,error_code *ec)

{
  ostream *poVar1;
  string local_50 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: Ffilesystem:");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,fname._M_str,fname._M_len);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path1._M_str,path1._M_len);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path2._M_str,path2._M_len);
  std::operator<<(poVar1,")  ");
  if (ec->_M_value != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"C++ exception:");
    (**(code **)(*(long *)ec->_M_cat + 0x20))(local_50,ec->_M_cat,ec->_M_value);
    poVar1 = std::operator<<(poVar1,local_50);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,ec->_M_value);
    std::operator<<(poVar1," ");
    std::__cxx11::string::~string(local_50);
  }
  fs_emit_error();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return;
}

Assistant:

void fs_print_error(std::string_view path1, std::string_view path2, std::string_view fname, const std::error_code& ec)
{
  std::cerr << "ERROR: Ffilesystem:" << fname << "(" << path1 <<  ", " << path2 << ")  ";

  if(ec)
    std::cerr << "C++ exception:" << ec.message() <<  " " << ec.value() << " ";

  fs_emit_error();

  std::cerr << std::endl;
}